

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_retrieveDuplicateIdItemLists_Test::TestBody
          (Annotator_retrieveDuplicateIdItemLists_Test *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *ppVar1;
  pointer ppVar2;
  code *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  string sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _func_void__Op_any_ptr__Arg_ptr *p_Var9;
  char cVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  mapped_type *pmVar14;
  void *pvVar15;
  undefined8 *puVar16;
  key_type *__k;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar17;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_17;
  char *pcVar18;
  pointer this_01;
  _func_void__Op_any_ptr__Arg_ptr *p_Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *ppVar20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_00;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_01;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_02;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  __l_04;
  AssertionResult gtest_ar_3;
  ModelPtr model;
  AssertionResult gtest_ar_1;
  VariablePtr c4v2;
  VariablePtr c2v2;
  VariablePtr c2v1;
  AssertionResult gtest_ar;
  VariablePtr c3v1;
  VariablePtr c4v1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  expectedItems;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids;
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  items;
  AnnotatorPtr annotator;
  ParserPtr parser;
  shared_ptr<libcellml::Component> local_9d0;
  long local_9c0 [2];
  shared_ptr<libcellml::Component> local_9b0;
  long local_9a0 [2];
  pointer local_990;
  undefined8 local_988;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_980;
  undefined1 local_978 [32];
  pointer local_958;
  undefined1 local_948 [16];
  undefined1 *local_938 [2];
  undefined1 local_928 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  *local_918 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_908;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_8d0;
  allocator_type local_88e;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_88d;
  allocator_type local_88c;
  allocator_type local_88b;
  allocator_type local_88a;
  allocator_type local_889;
  shared_ptr<libcellml::Units> local_888;
  long local_878 [2];
  undefined8 local_868;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  undefined8 local_858;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_850;
  undefined8 local_848;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  pair<libcellml::CellmlElementType,_std::any> local_838;
  undefined4 local_820;
  code *local_818;
  undefined8 *local_810;
  undefined4 local_808;
  code *local_800;
  undefined8 *local_7f8;
  undefined4 local_7f0;
  code *local_7e8;
  undefined8 *local_7e0;
  undefined4 local_7d8;
  code *local_7d0;
  undefined8 *local_7c8;
  undefined4 local_7c0;
  code *local_7b8;
  undefined8 *local_7b0;
  undefined4 local_7a8;
  code *local_7a0;
  undefined8 *local_798;
  undefined4 local_790;
  code *local_788;
  undefined8 *local_780;
  undefined8 local_778;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_770;
  long *local_768;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_760;
  long local_758 [2];
  long *local_748;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_740;
  long local_738 [2];
  undefined8 local_728;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_720;
  undefined8 local_718;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_710;
  undefined8 local_708;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_700;
  undefined8 local_6f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6f0;
  undefined8 local_6e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6e0;
  undefined8 local_6d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6d0;
  undefined8 local_6c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6c0;
  undefined8 local_6b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6b0;
  undefined8 local_6a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6a0;
  undefined8 local_698;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_690;
  undefined8 local_688;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_680;
  undefined8 local_678;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_670;
  undefined8 local_668;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_660;
  undefined8 local_658;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_650;
  undefined8 local_648;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_640;
  undefined8 local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_630;
  undefined8 local_628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_620;
  pair<libcellml::CellmlElementType,_std::any> local_618;
  undefined4 local_600;
  code *local_5f8;
  undefined8 *local_5f0;
  undefined4 local_5e8;
  code *local_5e0;
  undefined8 *local_5d8;
  undefined4 local_5d0;
  code *local_5c8;
  undefined8 *local_5c0;
  undefined4 local_5b8;
  code *local_5b0;
  undefined8 *local_5a8;
  undefined4 local_5a0;
  code *local_598;
  undefined8 *local_590;
  undefined4 local_588;
  code *local_580;
  undefined8 *local_578;
  undefined4 local_570;
  code *local_568;
  undefined8 *local_560;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  local_558;
  long *local_528 [2];
  long local_518 [2];
  long *local_508 [2];
  long local_4f8 [2];
  long *local_4e8 [2];
  long local_4d8 [2];
  long *local_4c8 [2];
  long local_4b8 [2];
  long *local_4a8 [2];
  long local_498 [2];
  long *local_488 [2];
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  long *local_448 [2];
  long local_438 [2];
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [2];
  long *local_3e8 [2];
  long local_3d8 [2];
  long *local_3c8 [2];
  long local_3b8 [2];
  long *local_3a8 [2];
  long local_398 [2];
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  key_type *local_348;
  string local_340 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_338;
  string local_330 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_328;
  string local_320 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  string local_310 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  string local_300 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2f8;
  string local_2f0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e8;
  string local_2e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d8;
  string local_2d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  string local_2c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  string local_2b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  pair<libcellml::CellmlElementType,_std::any> local_288;
  undefined4 local_270;
  code *local_268;
  undefined8 *local_260;
  undefined4 local_258;
  code *local_250;
  undefined8 *local_248;
  undefined4 local_240;
  code *local_238;
  undefined8 *local_230;
  undefined4 local_228;
  code *local_220;
  undefined8 *local_218;
  undefined4 local_210;
  code *local_208;
  undefined8 *local_200;
  undefined4 local_1f8;
  code *local_1f0;
  undefined8 *local_1e8;
  pair<libcellml::CellmlElementType,_std::any> local_1e0;
  undefined4 local_1c8;
  code *local_1c0;
  undefined8 *local_1b8;
  undefined4 local_1b0;
  code *local_1a8;
  undefined8 *local_1a0;
  undefined4 local_198;
  code *local_190;
  undefined8 *local_188;
  undefined4 local_180;
  code *local_178;
  undefined8 *local_170;
  undefined4 local_168;
  code *local_160;
  undefined8 *local_158;
  undefined4 local_150;
  code *local_148;
  undefined8 *local_140;
  long *local_138 [2];
  long local_128 [2];
  undefined8 local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  undefined8 local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  undefined1 local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_90;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_78;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_60;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_48;
  
  local_978._0_8_ = local_978 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"duplicateId1","");
  local_958 = (pointer)local_948;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"duplicateId2","");
  local_938[0] = local_928;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_938,"duplicateId3","");
  ppVar20 = &local_908;
  local_918[0] = ppVar20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_918,"duplicateId4","");
  __l._M_len = 4;
  __l._M_array = (iterator)local_978;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2a0,__l,(allocator_type *)&local_838);
  lVar17 = -0x80;
  do {
    ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)ppVar20[-1].second.
                super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar20 != ppVar1) {
      operator_delete(ppVar1,(ulong)((ppVar20->first)._M_dataplus._M_p + 1));
    }
    ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
               *)((long)&ppVar20[-1].first.field_2 + 8);
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0);
  libcellml::Parser::create(SUB81(local_a0,0));
  libcellml::Parser::parseModel((string *)&local_988);
  uVar6 = local_988;
  local_978._0_8_ = local_978 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"component2","");
  libcellml::ComponentEntity::component((string *)&local_618,SUB81(uVar6,0));
  local_838._0_8_ = &local_838.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"variable1","");
  libcellml::Component::variable((string *)&local_848);
  if ((_Storage *)local_838._0_8_ != &local_838.second._M_storage) {
    operator_delete((void *)local_838._0_8_,(long)local_838.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.second._M_manager);
  }
  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
    operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
  }
  uVar6 = local_988;
  local_978._0_8_ = local_978 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"component2","");
  libcellml::ComponentEntity::component((string *)&local_618,SUB81(uVar6,0));
  local_838._0_8_ = &local_838.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"variable2","");
  libcellml::Component::variable((string *)&local_858);
  if ((_Storage *)local_838._0_8_ != &local_838.second._M_storage) {
    operator_delete((void *)local_838._0_8_,(long)local_838.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.second._M_manager);
  }
  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
    operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
  }
  uVar6 = local_988;
  local_978._0_8_ = local_978 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"component2","");
  libcellml::ComponentEntity::component((string *)&local_1e0,SUB81(uVar6,0));
  local_838._0_8_ = &local_838.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"component3","");
  libcellml::ComponentEntity::component((string *)&local_288,(bool)(undefined1)local_1e0.first);
  local_618._0_8_ = &local_618.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"variable1","");
  libcellml::Component::variable((string *)&local_778);
  if ((_Storage *)local_618._0_8_ != &local_618.second._M_storage) {
    operator_delete((void *)local_618._0_8_,(long)local_618.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.second._M_manager);
  }
  if ((_Storage *)local_838._0_8_ != &local_838.second._M_storage) {
    operator_delete((void *)local_838._0_8_,(long)local_838.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0.second._M_manager);
  }
  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
    operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
  }
  uVar6 = local_988;
  local_978._0_8_ = local_978 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"component4","");
  libcellml::ComponentEntity::component((string *)&local_618,SUB81(uVar6,0));
  local_838._0_8_ = &local_838.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"variable1","");
  libcellml::Component::variable((string *)&local_628);
  if ((_Storage *)local_838._0_8_ != &local_838.second._M_storage) {
    operator_delete((void *)local_838._0_8_,(long)local_838.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.second._M_manager);
  }
  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
    operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
  }
  uVar6 = local_988;
  local_978._0_8_ = local_978 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"component4","");
  libcellml::ComponentEntity::component((string *)&local_618,SUB81(uVar6,0));
  local_838._0_8_ = &local_838.second._M_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"variable2","");
  libcellml::Component::variable((string *)&local_868);
  if ((_Storage *)local_838._0_8_ != &local_838.second._M_storage) {
    operator_delete((void *)local_838._0_8_,(long)local_838.second._M_storage._M_ptr + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_618.second._M_manager);
  }
  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
    operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
  }
  local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_9c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"units2","");
  libcellml::Model::units((string *)&local_638);
  p_Var4 = p_Stack_630;
  uVar7 = local_638;
  local_638 = 0;
  p_Stack_630 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_838.first = 0xd;
  local_838.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_838.second._M_storage._M_ptr = (void *)0x0;
  local_838.second._M_storage._M_ptr = operator_new(0x10);
  uVar6 = local_988;
  *(undefined8 *)local_838.second._M_storage._M_ptr = uVar7;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_838.second._M_storage._M_ptr + 8) =
       p_Var4;
  local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_9a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"component1","");
  libcellml::ComponentEntity::component(local_2b0,SUB81(uVar6,0));
  libcellml::ImportedEntity::importSource();
  p_Var4 = p_Stack_640;
  uVar6 = local_648;
  local_648 = 0;
  p_Stack_640 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_820 = 4;
  local_818 = std::any::_Manager_external<std::shared_ptr<libcellml::ImportSource>_>::_S_manage;
  local_810 = (undefined8 *)0x0;
  local_810 = (undefined8 *)operator_new(0x10);
  *local_810 = uVar6;
  local_810[1] = p_Var4;
  libcellml::VariablePair::create((shared_ptr *)&local_b8,(shared_ptr *)&local_628);
  p_Var4 = p_Stack_b0;
  uVar7 = local_b8;
  local_b8 = 0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_808 = 5;
  local_800 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_7f8 = (undefined8 *)0x0;
  local_7f8 = (undefined8 *)operator_new(0x10);
  uVar6 = local_988;
  *local_7f8 = uVar7;
  local_7f8[1] = p_Var4;
  local_748 = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"component2","");
  libcellml::ComponentEntity::component((string *)&local_658,SUB81(uVar6,0));
  p_Var4 = p_Stack_650;
  uVar6 = local_658;
  local_658 = 0;
  p_Stack_650 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7f0 = 0;
  local_7e8 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_7e0 = (undefined8 *)0x0;
  local_7e0 = (undefined8 *)operator_new(0x10);
  *local_7e0 = uVar6;
  local_7e0[1] = p_Var4;
  libcellml::VariablePair::create((shared_ptr *)&local_c8,(shared_ptr *)&local_848);
  p_Var4 = p_Stack_c0;
  uVar7 = local_c8;
  local_c8 = 0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7d8 = 2;
  local_7d0 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_7c8 = (undefined8 *)0x0;
  local_7c8 = (undefined8 *)operator_new(0x10);
  uVar6 = local_988;
  *local_7c8 = uVar7;
  local_7c8[1] = p_Var4;
  local_768 = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"component2","");
  libcellml::ComponentEntity::component(local_2c0,SUB81(uVar6,0));
  libcellml::Component::reset((ulong)&local_668);
  p_Var4 = p_Stack_660;
  uVar7 = local_668;
  local_668 = 0;
  p_Stack_660 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7c0 = 10;
  local_7b8 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_7b0 = (undefined8 *)0x0;
  local_7b0 = (undefined8 *)operator_new(0x10);
  uVar6 = local_988;
  *local_7b0 = uVar7;
  local_7b0[1] = p_Var4;
  local_888.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_878;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"component2","");
  libcellml::ComponentEntity::component(local_2d0,SUB81(uVar6,0));
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"component3","");
  libcellml::ComponentEntity::component((string *)&local_678,(bool)local_2d0[0]);
  p_Var4 = p_Stack_670;
  uVar7 = local_678;
  local_678 = 0;
  p_Stack_670 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_7a8 = 1;
  local_7a0 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_798 = (undefined8 *)0x0;
  local_798 = (undefined8 *)operator_new(0x10);
  uVar6 = local_988;
  *local_798 = uVar7;
  local_798[1] = p_Var4;
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"component2","");
  libcellml::ComponentEntity::component(local_2f0,SUB81(uVar6,0));
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"component3","");
  libcellml::ComponentEntity::component(local_2e0,(bool)local_2f0[0]);
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"variable2","");
  libcellml::Component::variable((string *)&local_688);
  p_Var4 = p_Stack_680;
  uVar6 = local_688;
  local_688 = 0;
  p_Stack_680 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_790 = 0xe;
  local_788 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_780 = (undefined8 *)0x0;
  local_780 = (undefined8 *)operator_new(0x10);
  *local_780 = uVar6;
  local_780[1] = p_Var4;
  __l_00._M_len = 8;
  __l_00._M_array = &local_838;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_48,__l_00,&local_889);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)local_978,(char (*) [13])"duplicateId1",&local_48);
  p_Var4 = local_980;
  uVar6 = local_988;
  if (local_980 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_980 + 8) = *(int *)(local_980 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_980 + 8) = *(int *)(local_980 + 8) + 1;
    }
  }
  local_618.first = 7;
  local_618.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::Model>_>::_S_manage;
  local_618.second._M_storage._M_ptr = (void *)0x0;
  local_618.second._M_storage._M_ptr = operator_new(0x10);
  *(undefined8 *)local_618.second._M_storage._M_ptr = uVar6;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_618.second._M_storage._M_ptr + 8) =
       p_Var4;
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"units1","");
  libcellml::Model::units((string *)&local_698);
  p_Var4 = p_Stack_690;
  uVar6 = local_698;
  local_698 = 0;
  p_Stack_690 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_600 = 0xd;
  local_5f8 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_5f0 = (undefined8 *)0x0;
  local_5f0 = (undefined8 *)operator_new(0x10);
  *local_5f0 = uVar6;
  local_5f0[1] = p_Var4;
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"blob","");
  libcellml::Model::units((string *)&local_6a8);
  p_Var4 = p_Stack_6a0;
  uVar6 = local_6a8;
  local_6a8 = 0;
  p_Stack_6a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5e8 = 0xd;
  local_5e0 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_5d8 = (undefined8 *)0x0;
  local_5d8 = (undefined8 *)operator_new(0x10);
  *local_5d8 = uVar6;
  local_5d8[1] = p_Var4;
  libcellml::VariablePair::create((shared_ptr *)&local_d8,(shared_ptr *)&local_868);
  p_Var8 = p_Stack_d0;
  uVar6 = local_d8;
  local_d8 = 0;
  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5d0 = 2;
  local_5c8 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_5c0 = (undefined8 *)0x0;
  local_5c0 = (undefined8 *)operator_new(0x10);
  p_Var4 = local_860;
  *local_5c0 = uVar6;
  local_5c0[1] = p_Var8;
  if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_860 + 8) = *(int *)(local_860 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_860 + 8) = *(int *)(local_860 + 8) + 1;
    }
  }
  local_5b8 = 0xe;
  local_5b0 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_5a8 = (undefined8 *)0x0;
  local_5a8 = (undefined8 *)operator_new(0x10);
  uVar6 = local_988;
  *local_5a8 = local_868;
  local_5a8[1] = p_Var4;
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"component2","");
  libcellml::ComponentEntity::component((string *)&local_6b8,SUB81(uVar6,0));
  p_Var4 = p_Stack_6b0;
  uVar7 = local_6b8;
  local_6b8 = 0;
  p_Stack_6b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5a0 = 1;
  local_598 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_590 = (undefined8 *)0x0;
  local_590 = (undefined8 *)operator_new(0x10);
  uVar6 = local_988;
  *local_590 = uVar7;
  local_590[1] = p_Var4;
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"component2","");
  libcellml::ComponentEntity::component(local_300,SUB81(uVar6,0));
  libcellml::Component::reset((ulong)&local_6c8);
  p_Var8 = p_Stack_6c0;
  uVar6 = local_6c8;
  local_6c8 = 0;
  p_Stack_6c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_588 = 8;
  local_580 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_578 = (undefined8 *)0x0;
  local_578 = (undefined8 *)operator_new(0x10);
  p_Var4 = local_770;
  *local_578 = uVar6;
  local_578[1] = p_Var8;
  if (local_770 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_770 + 8) = *(int *)(local_770 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_770 + 8) = *(int *)(local_770 + 8) + 1;
    }
  }
  local_570 = 0xe;
  local_568 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_560 = (undefined8 *)0x0;
  local_560 = (undefined8 *)operator_new(0x10);
  *local_560 = local_778;
  local_560[1] = p_Var4;
  __l_01._M_len = 8;
  __l_01._M_array = &local_618;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_60,__l_01,&local_88a);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)(local_948 + 8),(char (*) [13])"duplicateId2",&local_60);
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"units1","");
  libcellml::Model::units(local_310);
  libcellml::ImportedEntity::importSource();
  p_Var4 = p_Stack_6d0;
  uVar6 = local_6d8;
  local_6d8 = 0;
  p_Stack_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_288.first = IMPORT;
  local_288.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::ImportSource>_>::_S_manage;
  local_288.second._M_storage._M_ptr = (void *)0x0;
  local_288.second._M_storage._M_ptr = operator_new(0x10);
  *(undefined8 *)local_288.second._M_storage._M_ptr = uVar6;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_288.second._M_storage._M_ptr + 8) =
       p_Var4;
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"units3","");
  libcellml::Model::units((string *)&local_6e8);
  p_Var4 = p_Stack_6e0;
  uVar6 = local_6e8;
  local_6e8 = 0;
  p_Stack_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_270 = 0xd;
  local_268 = std::any::_Manager_external<std::shared_ptr<libcellml::Units>_>::_S_manage;
  local_260 = (undefined8 *)0x0;
  local_260 = (undefined8 *)operator_new(0x10);
  p_Var8 = local_620;
  *local_260 = uVar6;
  local_260[1] = p_Var4;
  if (local_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_620 + 8) = *(int *)(local_620 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_620 + 8) = *(int *)(local_620 + 8) + 1;
    }
  }
  local_258 = 0xe;
  local_250 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_248 = (undefined8 *)0x0;
  local_248 = (undefined8 *)operator_new(0x10);
  p_Var4 = local_850;
  *local_248 = local_628;
  local_248[1] = p_Var8;
  if (local_850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_850 + 8) = *(int *)(local_850 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_850 + 8) = *(int *)(local_850 + 8) + 1;
    }
  }
  local_240 = 0xe;
  local_238 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_230 = (undefined8 *)0x0;
  local_230 = (undefined8 *)operator_new(0x10);
  *local_230 = local_858;
  local_230[1] = p_Var4;
  libcellml::VariablePair::create((shared_ptr *)&local_e8,(shared_ptr *)&local_858);
  p_Var4 = p_Stack_e0;
  uVar7 = local_e8;
  local_e8 = 0;
  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_228 = 5;
  local_220 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_218 = (undefined8 *)0x0;
  local_218 = (undefined8 *)operator_new(0x10);
  uVar6 = local_988;
  *local_218 = uVar7;
  local_218[1] = p_Var4;
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"component2","");
  libcellml::ComponentEntity::component(local_320,SUB81(uVar6,0));
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"component3","");
  libcellml::ComponentEntity::component((string *)&local_6f8,(bool)local_320[0]);
  p_Var8 = p_Stack_6f0;
  uVar7 = local_6f8;
  local_6f8 = 0;
  p_Stack_6f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_210 = 0;
  local_208 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_200 = (undefined8 *)0x0;
  local_200 = (undefined8 *)operator_new(0x10);
  p_Var4 = local_980;
  uVar6 = local_988;
  *local_200 = uVar7;
  local_200[1] = p_Var8;
  if (local_980 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_980 + 8) = *(int *)(local_980 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_980 + 8) = *(int *)(local_980 + 8) + 1;
    }
  }
  local_1f8 = 3;
  local_1f0 = std::any::_Manager_external<std::shared_ptr<libcellml::Model>_>::_S_manage;
  local_1e8 = (undefined8 *)0x0;
  local_1e8 = (undefined8 *)operator_new(0x10);
  *local_1e8 = uVar6;
  local_1e8[1] = p_Var4;
  __l_02._M_len = 7;
  __l_02._M_array = &local_288;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_78,__l_02,&local_88b);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_908,(char (*) [13])"duplicateId3",&local_78);
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"units2","");
  libcellml::Model::units(local_330);
  libcellml::UnitsItem::create((shared_ptr *)&local_f8,(ulong)local_330);
  p_Var4 = p_Stack_f0;
  uVar6 = local_f8;
  local_f8 = 0;
  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e0.first = UNIT;
  local_1e0.second._M_manager =
       std::any::_Manager_external<std::shared_ptr<libcellml::UnitsItem>_>::_S_manage;
  local_1e0.second._M_storage._M_ptr = (void *)0x0;
  local_1e0.second._M_storage._M_ptr = operator_new(0x10);
  sVar5 = local_988._0_1_;
  *(undefined8 *)local_1e0.second._M_storage._M_ptr = uVar6;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_1e0.second._M_storage._M_ptr + 8) =
       p_Var4;
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"component1","");
  libcellml::ComponentEntity::component((string *)&local_708,(bool)sVar5);
  p_Var4 = p_Stack_700;
  uVar6 = local_708;
  local_708 = 0;
  p_Stack_700 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8 = 0;
  local_1c0 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_1b8 = (undefined8 *)0x0;
  local_1b8 = (undefined8 *)operator_new(0x10);
  sVar5 = local_988._0_1_;
  *local_1b8 = uVar6;
  local_1b8[1] = p_Var4;
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"component4","");
  libcellml::ComponentEntity::component((string *)&local_718,(bool)sVar5);
  p_Var4 = p_Stack_710;
  uVar6 = local_718;
  local_718 = 0;
  p_Stack_710 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1b0 = 0;
  local_1a8 = std::any::_Manager_external<std::shared_ptr<libcellml::Component>_>::_S_manage;
  local_1a0 = (undefined8 *)0x0;
  local_1a0 = (undefined8 *)operator_new(0x10);
  *local_1a0 = uVar6;
  local_1a0[1] = p_Var4;
  libcellml::VariablePair::create((shared_ptr *)&local_108,(shared_ptr *)&local_848);
  p_Var8 = p_Stack_100;
  uVar6 = local_108;
  local_108 = 0;
  p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_198 = 5;
  local_190 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_188 = (undefined8 *)0x0;
  local_188 = (undefined8 *)operator_new(0x10);
  p_Var4 = local_840;
  *local_188 = uVar6;
  local_188[1] = p_Var8;
  if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_840 + 8) = *(int *)(local_840 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_840 + 8) = *(int *)(local_840 + 8) + 1;
    }
  }
  local_180 = 0xe;
  local_178 = std::any::_Manager_external<std::shared_ptr<libcellml::Variable>_>::_S_manage;
  local_170 = (undefined8 *)0x0;
  local_170 = (undefined8 *)operator_new(0x10);
  *local_170 = local_848;
  local_170[1] = p_Var4;
  libcellml::VariablePair::create((shared_ptr *)&local_118,(shared_ptr *)&local_858);
  p_Var4 = p_Stack_110;
  uVar6 = local_118;
  local_118 = 0;
  p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168 = 5;
  local_160 = std::any::_Manager_external<std::shared_ptr<libcellml::VariablePair>_>::_S_manage;
  local_158 = (undefined8 *)0x0;
  local_158 = (undefined8 *)operator_new(0x10);
  *local_158 = uVar6;
  local_158[1] = p_Var4;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"component2","");
  libcellml::ComponentEntity::component(local_340,(bool)local_988._0_1_);
  libcellml::Component::reset((ulong)&local_728);
  p_Var4 = p_Stack_720;
  uVar6 = local_728;
  local_728 = 0;
  p_Stack_720 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_150 = 9;
  local_148 = std::any::_Manager_external<std::shared_ptr<libcellml::Reset>_>::_S_manage;
  local_140 = (undefined8 *)0x0;
  local_140 = (undefined8 *)operator_new(0x10);
  *local_140 = uVar6;
  local_140[1] = p_Var4;
  __l_03._M_len = 7;
  __l_03._M_array = &local_1e0;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_90,__l_03,&local_88c);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_8d0,(char (*) [13])"duplicateId4",&local_90);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_978;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
         *)&local_558,__l_04,&local_88d,&local_88e);
  lVar17 = -0xe0;
  this_00 = &local_8d0.second;
  do {
    std::
    vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
    ::~vector(this_00);
    ppVar2 = this_00[-2].
             super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((pointer)((long)(this_00 + -1) + 8) != ppVar2) {
      operator_delete(ppVar2,(ulong)((long)&((pointer)
                                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)((long)(this_00 + -1) + 8))->_M_allocated_capacity)
                                            ->first + 1));
    }
    this_00 = (vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
               *)&this_00[-3].
                  super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar17 = lVar17 + 0x38;
  } while (lVar17 != 0);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_90);
  lVar17 = 0x98;
  do {
    pcVar3 = *(code **)((long)&local_1e0.first + lVar17);
    if (pcVar3 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_1e0.first + lVar17);
      (*pcVar3)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x10);
  if (p_Stack_720 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_720);
  }
  if (local_338 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
  }
  if (p_Stack_710 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_710);
  }
  if (local_528[0] != local_518) {
    operator_delete(local_528[0],local_518[0] + 1);
  }
  if (p_Stack_700 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_700);
  }
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if (local_328 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328);
  }
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],local_4d8[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_78);
  lVar17 = 0x98;
  do {
    pcVar3 = *(code **)((long)&local_288.first + lVar17);
    if (pcVar3 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_288.first + lVar17);
      (*pcVar3)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x10);
  if (p_Stack_6f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6f0);
  }
  if (local_4c8[0] != local_4b8) {
    operator_delete(local_4c8[0],local_4b8[0] + 1);
  }
  if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318);
  }
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0],local_498[0] + 1);
  }
  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
  }
  if (p_Stack_6e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6e0);
  }
  if (local_488[0] != local_478) {
    operator_delete(local_488[0],local_478[0] + 1);
  }
  if (p_Stack_6d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6d0);
  }
  if (local_308 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_60);
  lVar17 = 0xb0;
  do {
    pcVar3 = *(code **)((long)&local_618.first + lVar17);
    if (pcVar3 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_618.first + lVar17);
      (*pcVar3)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x10);
  if (p_Stack_6c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6c0);
  }
  if (local_2f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f8);
  }
  if (local_448[0] != local_438) {
    operator_delete(local_448[0],local_438[0] + 1);
  }
  if (p_Stack_6b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6b0);
  }
  if (local_428[0] != local_418) {
    operator_delete(local_428[0],local_418[0] + 1);
  }
  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
  }
  if (p_Stack_6a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6a0);
  }
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  if (p_Stack_690 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_690);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_48);
  lVar17 = 0xb0;
  do {
    pcVar3 = *(code **)((long)&local_838.first + lVar17);
    if (pcVar3 != (code *)0x0) {
      puVar16 = (undefined8 *)((long)&local_838.first + lVar17);
      (*pcVar3)(3,puVar16,0);
      *puVar16 = 0;
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x10);
  if (p_Stack_680 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_680);
  }
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0],local_3b8[0] + 1);
  }
  if (local_2d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8);
  }
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0],local_398[0] + 1);
  }
  if (local_2e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e8);
  }
  if (local_388[0] != local_378) {
    operator_delete(local_388[0],local_378[0] + 1);
  }
  if (p_Stack_670 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_670);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  if (local_2c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8);
  }
  if (local_888.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_878) {
    operator_delete(local_888.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_878[0] + 1);
  }
  if (p_Stack_660 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_660);
  }
  if (local_2b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8);
  }
  if (local_768 != local_758) {
    operator_delete(local_768,local_758[0] + 1);
  }
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
  }
  if (p_Stack_650 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_650);
  }
  if (local_748 != local_738) {
    operator_delete(local_748,local_738[0] + 1);
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
  }
  if (p_Stack_640 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_640);
  }
  if (local_2a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a8);
  }
  if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_9a0) {
    operator_delete(local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_9a0[0] + 1);
  }
  if (p_Stack_630 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_630);
  }
  if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_9c0) {
    operator_delete(local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_9c0[0] + 1);
  }
  libcellml::Annotator::create();
  libcellml::Annotator::setModel((shared_ptr *)CONCAT44(local_1e0._4_4_,local_1e0.first));
  libcellml::Annotator::duplicateIds_abi_cxx11_();
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&local_838,"ids","annotator->duplicateIds()",&local_2a0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_978);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_978);
  if ((undefined1)local_838.first == COMPONENT) {
    testing::Message::Message((Message *)local_978);
    if (local_838.second._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      pcVar18 = "";
    }
    else {
      pcVar18 = *(char **)local_838.second._M_manager;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x721,pcVar18);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_618,(Message *)local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_618);
    if ((long *)local_978._0_8_ != (long *)0x0) {
      cVar10 = testing::internal::IsTrue(true);
      if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_978._0_8_ + 8))();
      }
      local_978._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_838.second,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348 = local_2a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = (pointer)0x0;
  __k = local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      libcellml::Annotator::items((string *)&local_288);
      p_Var9 = local_288.second._M_manager;
      p_Var19 = (_func_void__Op_any_ptr__Arg_ptr *)CONCAT44(local_288._4_4_,local_288.first);
      if (p_Var19 != local_288.second._M_manager) {
        lVar17 = 8;
        do {
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                  *)&local_558,__k);
          ppVar2 = (pmVar14->
                   super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar11 = libcellml::AnyCellmlElement::type();
          local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT44(local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _4_4_,uVar11);
          testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
                    ((internal *)local_978,"expectedItems[id][index].first","item->type()",
                     (CellmlElementType *)((long)ppVar2 + lVar17 + -8),
                     (CellmlElementType *)&local_9d0);
          if (local_978[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_9d0);
            pcVar18 = "";
            if ((pointer)local_978._8_8_ != (pointer)0x0) {
              pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_9b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                       ,0x728,pcVar18);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              cVar10 = testing::internal::IsTrue(true);
              if ((cVar10 != '\0') &&
                 (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0)) {
                (**(code **)(*(long *)local_9d0.
                                      super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 8))();
              }
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_978 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar11 = libcellml::AnyCellmlElement::type();
          switch(uVar11) {
          case 0:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Component>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::component();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                       "item->component()",&local_9d0,&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x72b,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 1:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Component>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::component();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                       "item->component()",&local_9d0,&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x72e,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 2:
            libcellml::AnyCellmlElement::variablePair();
            local_990 = (pointer)local_978._8_8_;
            local_978._0_8_ = (long *)0x0;
            local_978._8_8_ = (pointer)0x0;
            if (this_01 != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
            }
            if ((pointer)local_978._8_8_ != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_978._8_8_);
            }
            libcellml::VariablePair::variable1();
            libcellml::NamedEntity::name_abi_cxx11_();
            iVar12 = std::__cxx11::string::compare(local_978);
            if (iVar12 == 0) {
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     CONCAT71(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._1_7_,1);
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              libcellml::VariablePair::variable1();
              libcellml::NamedEntity::name_abi_cxx11_();
              iVar13 = std::__cxx11::string::compare((char *)&local_838);
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     CONCAT71(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._1_7_,iVar13 == 0);
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (iVar12 != 0) {
                if ((_Storage *)local_838._0_8_ != &local_838.second._M_storage) {
                  operator_delete((void *)local_838._0_8_,
                                  (long)local_838.second._M_storage._M_ptr + 1);
                }
                if (local_740 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_740);
                }
              }
            }
            if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
              operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
            }
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._0_1_ == (string)0x0) {
              testing::Message::Message((Message *)&local_9b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)local_978,(char *)&local_9d0,
                         "\"variable1\" == testPair->variable1()->name() || \"variable2\" == testPair->variable1()->name()"
                         ,"false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_888,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x733,(char *)local_978._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_888,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_888);
              if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
              }
              if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9b0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            libcellml::VariablePair::variable2();
            libcellml::NamedEntity::name_abi_cxx11_();
            iVar12 = std::__cxx11::string::compare(local_978);
            if (iVar12 == 0) {
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     CONCAT71(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._1_7_,1);
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              libcellml::VariablePair::variable2();
              libcellml::NamedEntity::name_abi_cxx11_();
              iVar13 = std::__cxx11::string::compare((char *)&local_618);
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     CONCAT71(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._1_7_,iVar13 == 0);
              local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (iVar12 != 0) {
                if ((_Storage *)local_618._0_8_ != &local_618.second._M_storage) {
                  operator_delete((void *)local_618._0_8_,
                                  (long)local_618.second._M_storage._M_ptr + 1);
                }
                if (local_760 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_760);
                }
              }
            }
            if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
              operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
            }
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._0_1_ == (string)0x0) {
              testing::Message::Message((Message *)&local_9b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)local_978,(char *)&local_9d0,
                         "\"variable1\" == testPair->variable2()->name() || \"variable2\" == testPair->variable2()->name()"
                         ,"false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_888,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x734,(char *)local_978._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_888,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_888);
              if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
              }
              if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9b0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            this_01 = local_990;
            break;
          case 3:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Model>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::model();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                       "item->model()",(shared_ptr<libcellml::Model> *)&local_9d0,
                       (shared_ptr<libcellml::Model> *)&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x737,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 4:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::ImportSource>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::importSource();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::ImportSourcePtr>(expectedItems[id][index].second)",
                       "item->importSource()",(shared_ptr<libcellml::ImportSource> *)&local_9d0,
                       (shared_ptr<libcellml::ImportSource> *)&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x73a,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 5:
            libcellml::AnyCellmlElement::variablePair();
            local_990 = (pointer)local_978._8_8_;
            local_978._0_8_ = (long *)0x0;
            local_978._8_8_ = (pointer)0x0;
            if (this_01 != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
            }
            if ((pointer)local_978._8_8_ != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_978._8_8_);
            }
            iVar12 = std::__cxx11::string::compare((char *)__k);
            if (iVar12 == 0) {
              libcellml::VariablePair::variable1();
              libcellml::NamedEntity::name_abi_cxx11_();
              testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                        ((internal *)&local_9d0,"\"variable1\"","testPair->variable1()->name()",
                         (char (*) [10])"variable1",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_978);
              if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
              }
              if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_9b0.
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._0_1_ == (string)0x0) {
                testing::Message::Message((Message *)local_978);
                pcVar18 = "";
                if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pcVar18 = *(char **)local_9d0.
                                      super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_9b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                           ,0x73f,pcVar18);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_9b0,(Message *)local_978);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
                if ((long *)local_978._0_8_ != (long *)0x0) {
                  cVar10 = testing::internal::IsTrue(true);
                  if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
                    (**(code **)(*(long *)local_978._0_8_ + 8))();
                  }
                  local_978._0_8_ = (long *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_9d0.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              libcellml::VariablePair::variable2();
              libcellml::NamedEntity::name_abi_cxx11_();
              testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                        ((internal *)&local_9d0,"\"variable1\"","testPair->variable2()->name()",
                         (char (*) [10])"variable1",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_978);
              if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
              }
              if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_9b0.
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._0_1_ == (string)0x0) {
                testing::Message::Message((Message *)local_978);
                pcVar18 = "";
                if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pcVar18 = *(char **)local_9d0.
                                      super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_9b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                           ,0x740,pcVar18);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_9b0,(Message *)local_978);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
                if ((long *)local_978._0_8_ != (long *)0x0) {
                  cVar10 = testing::internal::IsTrue(true);
                  if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
                    (**(code **)(*(long *)local_978._0_8_ + 8))();
                  }
                  local_978._0_8_ = (long *)0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_9d0.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              this_01 = local_990;
            }
            else {
              iVar12 = std::__cxx11::string::compare((char *)__k);
              if (iVar12 == 0) {
                libcellml::VariablePair::variable1();
                libcellml::NamedEntity::name_abi_cxx11_();
                testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                          ((internal *)&local_9d0,"\"variable2\"","testPair->variable1()->name()",
                           (char (*) [10])"variable2",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_978);
                if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                  operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
                }
                if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_9b0.
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._0_1_ == (string)0x0) {
                  testing::Message::Message((Message *)local_978);
                  pcVar18 = "";
                  if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    pcVar18 = *(char **)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_9b0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                             ,0x742,pcVar18);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_9b0,(Message *)local_978);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
                  if ((long *)local_978._0_8_ != (long *)0x0) {
                    cVar10 = testing::internal::IsTrue(true);
                    if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
                      (**(code **)(*(long *)local_978._0_8_ + 8))();
                    }
                    local_978._0_8_ = (long *)0x0;
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_9d0.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                libcellml::VariablePair::variable2();
                libcellml::NamedEntity::name_abi_cxx11_();
                testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                          ((internal *)&local_9d0,"\"variable2\"","testPair->variable2()->name()",
                           (char (*) [10])"variable2",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_978);
                if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                  operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
                }
                if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_9b0.
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._0_1_ == (string)0x0) {
                  testing::Message::Message((Message *)local_978);
                  pcVar18 = "";
                  if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    pcVar18 = *(char **)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_9b0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                             ,0x743,pcVar18);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_9b0,(Message *)local_978);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
                  if ((long *)local_978._0_8_ != (long *)0x0) {
                    cVar10 = testing::internal::IsTrue(true);
                    if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
                      (**(code **)(*(long *)local_978._0_8_ + 8))();
                    }
                    local_978._0_8_ = (long *)0x0;
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_9d0.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                this_01 = local_990;
              }
              else {
                iVar12 = std::__cxx11::string::compare((char *)__k);
                this_01 = local_990;
                if (iVar12 == 0) {
                  libcellml::VariablePair::variable1();
                  libcellml::NamedEntity::name_abi_cxx11_();
                  iVar12 = std::__cxx11::string::compare(local_978);
                  if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                    operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
                  }
                  if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_9d0.
                               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (iVar12 == 0) {
                    libcellml::VariablePair::variable1();
                    libcellml::NamedEntity::name_abi_cxx11_();
                    testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                              ((internal *)&local_9d0,"\"variable1\"",
                               "testPair->variable1()->name()",(char (*) [10])"variable1",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_978);
                    if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                      operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
                    }
                    if (local_9b0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_9b0.
                                 super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    if (local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _0_1_ == (string)0x0) {
                      testing::Message::Message((Message *)local_978);
                      pcVar18 = "";
                      if (local_9d0.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        pcVar18 = *(char **)local_9d0.
                                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_9b0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                                 ,0x746,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_9b0,(Message *)local_978);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
                      if ((long *)local_978._0_8_ != (long *)0x0) {
                        cVar10 = testing::internal::IsTrue(true);
                        if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
                          (**(code **)(*(long *)local_978._0_8_ + 8))();
                        }
                        local_978._0_8_ = (long *)0x0;
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_9d0.
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    libcellml::VariablePair::variable2();
                    libcellml::NamedEntity::name_abi_cxx11_();
                    testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                              ((internal *)&local_9d0,"\"variable1\"",
                               "testPair->variable2()->name()",(char (*) [10])"variable1",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_978);
                    if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                      operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
                    }
                    if (local_9b0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_9b0.
                                 super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    if (local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _0_1_ == (string)0x0) {
                      testing::Message::Message((Message *)local_978);
                      pcVar18 = "";
                      if (local_9d0.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        pcVar18 = *(char **)local_9d0.
                                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_9b0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                                 ,0x747,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_9b0,(Message *)local_978);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
                      if ((long *)local_978._0_8_ != (long *)0x0) {
                        cVar10 = testing::internal::IsTrue(true);
                        if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
                          (**(code **)(*(long *)local_978._0_8_ + 8))();
                        }
                        local_978._0_8_ = (long *)0x0;
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_9d0.
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    this_01 = local_990;
                  }
                  else {
                    libcellml::VariablePair::variable1();
                    libcellml::NamedEntity::name_abi_cxx11_();
                    testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                              ((internal *)&local_9d0,"\"variable2\"",
                               "testPair->variable1()->name()",(char (*) [10])"variable2",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_978);
                    if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                      operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
                    }
                    if (local_9b0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_9b0.
                                 super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    if (local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _0_1_ == (string)0x0) {
                      testing::Message::Message((Message *)local_978);
                      pcVar18 = "";
                      if (local_9d0.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        pcVar18 = *(char **)local_9d0.
                                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_9b0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                                 ,0x749,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_9b0,(Message *)local_978);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
                      if ((long *)local_978._0_8_ != (long *)0x0) {
                        cVar10 = testing::internal::IsTrue(true);
                        if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
                          (**(code **)(*(long *)local_978._0_8_ + 8))();
                        }
                        local_978._0_8_ = (long *)0x0;
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_9d0.
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    libcellml::VariablePair::variable2();
                    libcellml::NamedEntity::name_abi_cxx11_();
                    testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                              ((internal *)&local_9d0,"\"variable2\"",
                               "testPair->variable2()->name()",(char (*) [10])"variable2",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_978);
                    if ((undefined1 *)local_978._0_8_ != local_978 + 0x10) {
                      operator_delete((void *)local_978._0_8_,local_978._16_8_ + 1);
                    }
                    if (local_9b0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_9b0.
                                 super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    if (local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                        _0_1_ == (string)0x0) {
                      testing::Message::Message((Message *)local_978);
                      pcVar18 = "";
                      if (local_9d0.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        pcVar18 = *(char **)local_9d0.
                                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_9b0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                                 ,0x74a,pcVar18);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_9b0,(Message *)local_978);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
                      if ((long *)local_978._0_8_ != (long *)0x0) {
                        cVar10 = testing::internal::IsTrue(true);
                        if ((cVar10 != '\0') && ((long *)local_978._0_8_ != (long *)0x0)) {
                          (**(code **)(*(long *)local_978._0_8_ + 8))();
                        }
                        local_978._0_8_ = (long *)0x0;
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_9d0.
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    this_01 = local_990;
                  }
                }
              }
            }
            break;
          case 7:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Model>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::model();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                       "item->model()",(shared_ptr<libcellml::Model> *)&local_9d0,
                       (shared_ptr<libcellml::Model> *)&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x74f,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 8:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9d0,
                       (shared_ptr<libcellml::Reset> *)&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x752,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 9:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9d0,
                       (shared_ptr<libcellml::Reset> *)&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x755,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 10:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Reset>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::reset();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                       "item->reset()",(shared_ptr<libcellml::Reset> *)&local_9d0,
                       (shared_ptr<libcellml::Reset> *)&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x758,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 0xc:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            pvVar15 = std::__any_caster<std::shared_ptr<libcellml::UnitsItem>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (pvVar15 == (void *)0x0) {
              std::__throw_bad_any_cast();
            }
            p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar15 + 8);
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(p_Var4 + 8) = *(int *)(p_Var4 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(p_Var4 + 8) = *(int *)(p_Var4 + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::unitsItem();
            libcellml::UnitsItem::units();
            libcellml::UnitsItem::units();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                      ((internal *)&local_9d0,"ue->units()","ua->units()",
                       (shared_ptr<libcellml::Units> *)&local_9b0,&local_888);
            if (local_888.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_888.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._0_1_ == (string)0x0) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar18 = "";
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar18 = *(char **)local_9d0.
                                    super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_888,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x75d,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_888,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_888);
              if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9b0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)libcellml::UnitsItem::index();
            local_888.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)libcellml::UnitsItem::index();
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&local_9d0,"ue->index()","ua->index()",
                       (unsigned_long *)&local_9b0,(unsigned_long *)&local_888);
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._0_1_ == (string)0x0) {
              testing::Message::Message((Message *)&local_9b0);
              pcVar18 = "";
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar18 = *(char **)local_9d0.
                                    super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_888,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x75e,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_888,(Message *)&local_9b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_888);
              if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9b0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9d0.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if ((pointer)local_978._8_8_ != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_978._8_8_);
            }
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            break;
          case 0xd:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Units>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::units();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::UnitsPtr>(expectedItems[id][index].second)",
                       "item->units()",(shared_ptr<libcellml::Units> *)&local_9d0,
                       (shared_ptr<libcellml::Units> *)&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x762,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          case 0xe:
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
                                    *)&local_558,__k);
            puVar16 = (undefined8 *)
                      std::__any_caster<std::shared_ptr<libcellml::Variable>>
                                ((any *)((long)&((pmVar14->
                                                 super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->first
                                        + lVar17));
            if (puVar16 == (undefined8 *)0x0) {
              std::__throw_bad_any_cast();
            }
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*puVar16;
            local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar16[1];
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) =
                     *(int *)(local_9d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 8) + 1;
              }
            }
            libcellml::AnyCellmlElement::variable();
            testing::internal::
            CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
                      ((internal *)local_978,
                       "std::any_cast<libcellml::VariablePtr>(expectedItems[id][index].second)",
                       "item->variable()",(shared_ptr<libcellml::Variable> *)&local_9d0,
                       (shared_ptr<libcellml::Variable> *)&local_9b0);
            if (local_9b0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9b0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_9d0.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_978[0] == (string)0x0) {
              testing::Message::Message((Message *)&local_9d0);
              pcVar18 = "";
              if ((pointer)local_978._8_8_ != (pointer)0x0) {
                pcVar18 = ((_Alloc_hider *)local_978._8_8_)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_9b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                         ,0x765,pcVar18);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_9b0,(Message *)&local_9d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9b0);
              if (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                cVar10 = testing::internal::IsTrue(true);
                if ((cVar10 != '\0') &&
                   (local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0)) {
                  (**(code **)(*(long *)local_9d0.
                                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8))();
                }
                local_9d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_978 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          p_Var19 = p_Var19 + 0x10;
          lVar17 = lVar17 + 0x18;
        } while (p_Var19 != p_Var9);
      }
      std::
      vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
      ::~vector((vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
                 *)&local_288);
      __k = __k + 1;
    } while (__k != local_348);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0.second._M_manager !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0.second._M_manager);
  }
  if (this_01 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::~_Rb_tree(&local_558);
  if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
  }
  if (local_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_620);
  }
  if (local_770 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_770);
  }
  if (local_850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_850);
  }
  if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
  }
  if (local_980 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_980);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0);
  return;
}

Assistant:

TEST(Annotator, duplicateIdBehaviour)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();
    auto component = libcellml::Component::create();
    auto variable = libcellml::Variable::create();

    model->setId("duplicateId");
    component->setId("duplicateId");
    variable->setId("duplicateId");

    component->addVariable(variable);
    model->addComponent(component);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("duplicateId")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    EXPECT_FALSE(annotator->isUnique("duplicateId"));
    EXPECT_EQ(size_t(3), annotator->itemCount("duplicateId"));
}